

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void __thiscall Fossilize::StateRecorder::Impl::push_work_locked(Impl *this,WorkItem *item)

{
  iterator *piVar1;
  _Elt_pointer pWVar2;
  uint64_t uVar3;
  Hash HVar4;
  VkStructureType VVar5;
  undefined4 uVar6;
  
  pWVar2 = (this->record_queue).c.
           super__Deque_base<Fossilize::WorkItem,_std::allocator<Fossilize::WorkItem>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pWVar2 == (this->record_queue).c.
                super__Deque_base<Fossilize::WorkItem,_std::allocator<Fossilize::WorkItem>_>._M_impl
                .super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<Fossilize::WorkItem,std::allocator<Fossilize::WorkItem>>::
    _M_push_back_aux<Fossilize::WorkItem_const&>
              ((deque<Fossilize::WorkItem,std::allocator<Fossilize::WorkItem>> *)&this->record_queue
               ,item);
  }
  else {
    VVar5 = item->type;
    uVar6 = *(undefined4 *)&item->field_0x4;
    uVar3 = item->handle;
    HVar4 = item->custom_hash;
    pWVar2->create_info = item->create_info;
    pWVar2->custom_hash = HVar4;
    pWVar2->type = VVar5;
    *(undefined4 *)&pWVar2->field_0x4 = uVar6;
    pWVar2->handle = uVar3;
    piVar1 = &(this->record_queue).c.
              super__Deque_base<Fossilize::WorkItem,_std::allocator<Fossilize::WorkItem>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  std::condition_variable::notify_one();
  return;
}

Assistant:

void StateRecorder::Impl::push_work_locked(const WorkItem &item)
{
	record_queue.push(item);
	record_cv.notify_one();
}